

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_11.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  reference piVar2;
  ostream *poVar3;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_48;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_40;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_38;
  iterator it;
  int maxFibonacciThatFitsInInt;
  bool isNegativeNumFound;
  vector<int,_std::allocator<int>_> series;
  int n;
  
  series.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  std::operator<<((ostream *)&std::cout,"How many Fibonacci numbers needs to be found:\n");
  series.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0;
  std::istream::operator>>
            ((istream *)&std::cin,
             (int *)&series.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  calculateFibonacci((vector<int,_std::allocator<int>_> *)&maxFibonacciThatFitsInInt,
                     (int32_t)series.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage);
  it._M_current._7_1_ = 0;
  it._M_current._0_4_ = 0;
  local_38._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)&maxFibonacciThatFitsInInt);
  while( true ) {
    local_40._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)&maxFibonacciThatFitsInInt);
    bVar1 = __gnu_cxx::operator<(&local_38,&local_40);
    if (!bVar1) break;
    piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_38);
    if ((*piVar2 < 0) && ((it._M_current._7_1_ & 1) == 0)) {
      it._M_current._7_1_ = 1;
      local_48 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator-(&local_38,1);
      piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_48);
      it._M_current._0_4_ = *piVar2;
    }
    piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_38);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar2);
    std::operator<<(poVar3,' ');
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_38);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "\nMax Fibonacci number that fits into 32 bit integer is: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)it._M_current);
  std::operator<<(poVar3,'\n');
  series.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)&maxFibonacciThatFitsInInt);
  return series.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_;
}

Assistant:

int main()
{
	std::cout << "How many Fibonacci numbers needs to be found:\n";
	auto n = 0;
	std::cin >> n;
	auto series = calculateFibonacci(n);
	bool isNegativeNumFound = false;
	auto maxFibonacciThatFitsInInt = 0;
	for (auto it = series.begin(); it < series.end(); ++it)
	{
		if (*it < 0 && not isNegativeNumFound)
		{
			isNegativeNumFound = true;
			maxFibonacciThatFitsInInt = *(it - 1);
		}
		std::cout << *it << ' ';
	}
	std::cout << "\nMax Fibonacci number that fits into 32 bit integer is: "
			  << maxFibonacciThatFitsInInt << '\n';
	return 0;
}